

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O0

void P_SetSlope(secplane_t *plane,bool setCeil,int xyangi,int zangi,DVector3 *pos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double aa;
  double bb;
  fixed_t fVar5;
  fixed_t fVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  double dist;
  DVector3 norm;
  DAngle zang;
  DAngle xyang;
  DVector3 *pos_local;
  int zangi_local;
  int xyangi_local;
  bool setCeil_local;
  secplane_t *plane_local;
  
  TAngle<double>::TAngle(&zang);
  TAngle<double>::TAngle((TAngle<double> *)&norm.Z);
  if (zangi < 0xb4) {
    if (zangi < 1) {
      TAngle<double>::operator=((TAngle<double> *)&norm.Z,1.0);
    }
    else {
      TAngle<double>::operator=((TAngle<double> *)&norm.Z,(double)zangi);
    }
  }
  else {
    TAngle<double>::operator=((TAngle<double> *)&norm.Z,179.0);
  }
  if (setCeil) {
    TAngle<double>::operator+=((TAngle<double> *)&norm.Z,180.0);
  }
  TAngle<double>::operator=(&zang,(double)xyangi);
  TVector3<double>::TVector3((TVector3<double> *)&dist);
  if ((ib_compatflags & 1U) == 0) {
    dVar8 = TAngle<double>::Cos((TAngle<double> *)&norm.Z);
    dVar9 = TAngle<double>::Cos(&zang);
    pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,0);
    *pdVar7 = dVar8 * dVar9;
    dVar8 = TAngle<double>::Cos((TAngle<double> *)&norm.Z);
    dVar9 = TAngle<double>::Sin(&zang);
    pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,1);
    *pdVar7 = dVar8 * dVar9;
  }
  else {
    dVar8 = TAngle<double>::Cos((TAngle<double> *)&norm.Z);
    fVar5 = FloatToFixed(dVar8);
    dVar8 = TAngle<double>::Cos(&zang);
    fVar6 = FloatToFixed(dVar8);
    dVar8 = FixedToFloat(fVar5 * fVar6);
    pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,0);
    *pdVar7 = dVar8 / 65536.0;
    dVar8 = TAngle<double>::Cos((TAngle<double> *)&norm.Z);
    fVar5 = FloatToFixed(dVar8);
    dVar8 = TAngle<double>::Sin(&zang);
    fVar6 = FloatToFixed(dVar8);
    dVar8 = FixedToFloat(fVar5 * fVar6);
    pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,1);
    *pdVar7 = dVar8 / 65536.0;
  }
  dVar8 = TAngle<double>::Sin((TAngle<double> *)&norm.Z);
  pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,2);
  *pdVar7 = dVar8;
  TVector3<double>::MakeUnit((TVector3<double> *)&dist);
  pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,0);
  dVar8 = *pdVar7;
  dVar9 = pos->X;
  pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,1);
  dVar1 = *pdVar7;
  dVar2 = pos->Y;
  pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,2);
  dVar3 = *pdVar7;
  dVar4 = pos->Z;
  pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,0);
  aa = *pdVar7;
  pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,1);
  bb = *pdVar7;
  pdVar7 = TVector3<double>::operator[]((TVector3<double> *)&dist,2);
  secplane_t::set(plane,aa,bb,*pdVar7,(-dVar8 * dVar9 - dVar1 * dVar2) - dVar3 * dVar4);
  return;
}

Assistant:

void P_SetSlope (secplane_t *plane, bool setCeil, int xyangi, int zangi, const DVector3 &pos)
{
	DAngle xyang;
	DAngle zang;

	if (zangi >= 180)
	{
		zang = 179.;
	}
	else if (zangi <= 0)
	{
		zang = 1.;
	}
	else
	{
		zang = (double)zangi;
	}
	if (setCeil)
	{
		zang += 180.;
	}

	xyang = (double)xyangi;

	DVector3 norm;

	if (ib_compatflags & BCOMPATF_SETSLOPEOVERFLOW)
	{
		// We have to consider an integer multiplication overflow here.
		norm[0] = FixedToFloat(FloatToFixed(zang.Cos()) * FloatToFixed(xyang.Cos())) / 65536.;
		norm[1] = FixedToFloat(FloatToFixed(zang.Cos()) * FloatToFixed(xyang.Sin())) / 65536.;
	}
	else
	{
		norm[0] = zang.Cos() * xyang.Cos();
		norm[1] = zang.Cos() * xyang.Sin();
	}
	norm[2] = zang.Sin();
	norm.MakeUnit();
	double dist = -norm[0] * pos.X - norm[1] * pos.Y - norm[2] * pos.Z;
	plane->set(norm[0], norm[1], norm[2], dist);
}